

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::AndroidEnergyConsumer::Serialize(AndroidEnergyConsumer *this,Message *msg)

{
  uint8_t *src_begin;
  ulong uVar1;
  
  uVar1 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  if ((uVar1 & 2) != 0) {
    protozero::Message::AppendVarInt<int>(msg,1,this->energy_consumer_id_);
    uVar1 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar1 & 4) != 0) {
    protozero::Message::AppendVarInt<int>(msg,2,this->ordinal_);
    uVar1 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar1 & 8) != 0) {
    protozero::Message::AppendString(msg,3,&this->type_);
    uVar1 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar1 & 0x10) != 0) {
    protozero::Message::AppendString(msg,4,&this->name_);
  }
  src_begin = (uint8_t *)(this->unknown_fields_)._M_dataplus._M_p;
  protozero::Message::WriteToStream
            (msg,src_begin,src_begin + (this->unknown_fields_)._M_string_length);
  return;
}

Assistant:

void AndroidEnergyConsumer::Serialize(::protozero::Message* msg) const {
  // Field 1: energy_consumer_id
  if (_has_field_[1]) {
    msg->AppendVarInt(1, energy_consumer_id_);
  }

  // Field 2: ordinal
  if (_has_field_[2]) {
    msg->AppendVarInt(2, ordinal_);
  }

  // Field 3: type
  if (_has_field_[3]) {
    msg->AppendString(3, type_);
  }

  // Field 4: name
  if (_has_field_[4]) {
    msg->AppendString(4, name_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}